

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

uint32_t __thiscall wasm::WasmBinaryWriter::getTypeIndex(WasmBinaryWriter *this,HeapType type)

{
  const_iterator cVar1;
  ostream *poVar2;
  key_type local_10;
  HeapType type_local;
  
  local_10.id = type.id;
  cVar1 = std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->indexedTypes).indices._M_h,&local_10);
  if (cVar1.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>._M_cur !=
      (__node_type *)0x0) {
    return *(uint32_t *)
            ((long)cVar1.
                   super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
                   _M_cur + 0x10);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Missing type: ");
  poVar2 = wasm::operator<<(poVar2,(HeapType)local_10.id);
  std::operator<<(poVar2,'\n');
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                ,0x2d6,"uint32_t wasm::WasmBinaryWriter::getTypeIndex(HeapType) const");
}

Assistant:

uint32_t WasmBinaryWriter::getTypeIndex(HeapType type) const {
  auto it = indexedTypes.indices.find(type);
#ifndef NDEBUG
  if (it == indexedTypes.indices.end()) {
    std::cout << "Missing type: " << type << '\n';
    assert(0);
  }
#endif
  return it->second;
}